

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [32];
  __m256i alVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  longlong local_88;
  longlong lStack_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong local_48;
  longlong lStack_40;
  longlong lStack_38;
  longlong lStack_30;
  longlong local_28;
  longlong lStack_20;
  longlong lStack_18;
  longlong lStack_10;
  
  lVar14 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x168);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x180);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x240);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x220);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x1a0);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x1e0);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  auVar18._4_4_ = iVar13;
  auVar18._0_4_ = iVar13;
  auVar18._8_4_ = iVar13;
  auVar18._12_4_ = iVar13;
  auVar18._16_4_ = iVar13;
  auVar18._20_4_ = iVar13;
  auVar18._24_4_ = iVar13;
  auVar18._28_4_ = iVar13;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar15);
  auVar17 = vpsubd_avx2(auVar18,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar15 = vpmulld_avx2(auVar3,auVar20);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar15,auVar17);
  auVar22 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar20);
  auVar15 = vpmulld_avx2(auVar23,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpsubd_avx2(auVar17,auVar15);
  auVar5 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar15 = vpmulld_avx2(auVar3,auVar19);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar15,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar19);
  auVar15 = vpmulld_avx2(auVar24,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpsubd_avx2(auVar17,auVar15);
  auVar7 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2(auVar4,auVar24);
  auVar15 = vpmulld_avx2(auVar5,auVar19);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar17,auVar15);
  auVar15 = vpmulld_avx2(auVar4,auVar19);
  auVar19 = vpmulld_avx2(auVar24,auVar5);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar11 = vpsubd_avx2(auVar15,auVar19);
  auVar15 = vpmulld_avx2((undefined1  [32])alVar2,auVar21);
  auVar23 = vpmulld_avx2(auVar3,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar19 = vpaddd_avx2(auVar15,auVar23);
  auVar25 = vpsubd_avx2(auVar15,auVar23);
  auVar15 = vpmulld_avx2(auVar6,auVar21);
  auVar24 = vpmulld_avx2(auVar7,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar23 = vpaddd_avx2(auVar15,auVar24);
  auVar26 = vpsubd_avx2(auVar15,auVar24);
  auVar15 = vpmulld_avx2(auVar4,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar20 = vpmulld_avx2(auVar5,auVar21);
  auVar24 = vpaddd_avx2(auVar15,auVar20);
  auVar27 = vpsubd_avx2(auVar15,auVar20);
  auVar22 = ZEXT416((uint)bit);
  alVar16 = (__m256i)vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar16,auVar21);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar11 = vpsrad_avx2(auVar11,auVar22);
  auVar20 = vpmulld_avx2(auVar11,auVar21);
  auVar15 = vpaddd_avx2(auVar17,auVar20);
  auVar20 = vpsubd_avx2(auVar17,auVar20);
  auVar17 = vpsrad_avx2(auVar19,auVar22);
  auVar19 = vpsrad_avx2(auVar25,auVar22);
  alVar8 = (__m256i)vpsrad_avx2(auVar23,auVar22);
  auVar23 = vpsrad_avx2(auVar26,auVar22);
  alVar9 = (__m256i)vpsrad_avx2(auVar24,auVar22);
  auVar24 = vpsrad_avx2(auVar27,auVar22);
  auVar15 = vpsrad_avx2(auVar15,ZEXT416((uint)bit));
  alVar10 = (__m256i)vpsrad_avx2(auVar20,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar13 = 10;
    if (10 < bd) {
      iVar13 = bd;
    }
    iVar13 = 0x20 << ((byte)iVar13 & 0x1f);
    iVar12 = -iVar13;
    auVar25._4_4_ = iVar12;
    auVar25._0_4_ = iVar12;
    auVar25._8_4_ = iVar12;
    auVar25._12_4_ = iVar12;
    auVar25._16_4_ = iVar12;
    auVar25._20_4_ = iVar12;
    auVar25._24_4_ = iVar12;
    auVar25._28_4_ = iVar12;
    iVar13 = iVar13 + -1;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar13;
    auVar26._12_4_ = iVar13;
    auVar26._16_4_ = iVar13;
    auVar26._20_4_ = iVar13;
    auVar26._24_4_ = iVar13;
    auVar26._28_4_ = iVar13;
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar13;
    auVar27._12_4_ = iVar13;
    auVar27._16_4_ = iVar13;
    auVar27._20_4_ = iVar13;
    auVar27._24_4_ = iVar13;
    auVar27._28_4_ = iVar13;
    auVar20 = vpaddd_avx2(auVar27,(undefined1  [32])alVar2);
    auVar4 = vpsubd_avx2(auVar27,auVar4);
    auVar20 = vpsrad_avx2(auVar20,ZEXT416((uint)out_shift));
    auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)out_shift));
    auVar20 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    *out = alVar2;
    auVar20 = vpmaxsd_avx2(auVar4,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[1] = alVar2;
    auVar20 = vpaddd_avx2((undefined1  [32])alVar16,auVar27);
    auVar4 = vpsubd_avx2(auVar27,auVar6);
    auVar22 = ZEXT416((uint)out_shift);
    auVar20 = vpsrad_avx2(auVar20,auVar22);
    auVar4 = vpsrad_avx2(auVar4,auVar22);
    auVar20 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[2] = alVar2;
    auVar20 = vpmaxsd_avx2(auVar4,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[3] = alVar2;
    auVar20 = vpaddd_avx2(auVar27,(undefined1  [32])alVar8);
    auVar4 = vpsubd_avx2(auVar27,auVar15);
    auVar15 = vpsrad_avx2(auVar20,auVar22);
    auVar20 = vpsrad_avx2(auVar4,auVar22);
    auVar15 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[4] = alVar2;
    auVar15 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[5] = alVar2;
    auVar15 = vpaddd_avx2((undefined1  [32])alVar9,auVar27);
    auVar20 = vpsubd_avx2(auVar27,auVar17);
    auVar22 = ZEXT416((uint)out_shift);
    auVar17 = vpsrad_avx2(auVar15,auVar22);
    auVar15 = vpsrad_avx2(auVar20,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[6] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[7] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar19);
    auVar15 = vpsubd_avx2(auVar27,auVar24);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[8] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[9] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,(undefined1  [32])alVar10);
    auVar15 = vpsubd_avx2(auVar27,auVar23);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[10] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xb] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar7);
    auVar15 = vpsubd_avx2(auVar27,auVar11);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xc] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xd] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar5);
    auVar15 = vpsubd_avx2(auVar27,auVar3);
    auVar17 = vpsrad_avx2(auVar17,ZEXT416((uint)out_shift));
    auVar15 = vpsrad_avx2(auVar15,ZEXT416((uint)out_shift));
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    auVar15 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    alVar16 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[0xe] = alVar2;
  }
  else {
    *out = alVar2;
    auVar20 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar4);
    out[1] = alVar2;
    out[2] = alVar16;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar6);
    out[3] = alVar2;
    out[4] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar15);
    out[5] = alVar2;
    out[6] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar17);
    out[7] = alVar2;
    local_88 = auVar19._0_8_;
    lStack_80 = auVar19._8_8_;
    lStack_78 = auVar19._16_8_;
    lStack_70 = auVar19._24_8_;
    out[8][0] = local_88;
    out[8][1] = lStack_80;
    out[8][2] = lStack_78;
    out[8][3] = lStack_70;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar24);
    out[9] = alVar2;
    out[10] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar23);
    out[0xb] = alVar2;
    local_48 = auVar7._0_8_;
    lStack_40 = auVar7._8_8_;
    lStack_38 = auVar7._16_8_;
    lStack_30 = auVar7._24_8_;
    out[0xc][0] = local_48;
    out[0xc][1] = lStack_40;
    out[0xc][2] = lStack_38;
    out[0xc][3] = lStack_30;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar11);
    out[0xd] = alVar2;
    local_28 = auVar5._0_8_;
    lStack_20 = auVar5._8_8_;
    lStack_18 = auVar5._16_8_;
    lStack_10 = auVar5._24_8_;
    out[0xe][0] = local_28;
    out[0xe][1] = lStack_20;
    out[0xe][2] = lStack_18;
    out[0xe][3] = lStack_10;
    alVar16 = (__m256i)vpsubd_avx2(auVar20,auVar3);
  }
  out[0xf] = alVar16;
  return;
}

Assistant:

static void iadst16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i v[16], x, y, temp1, temp2;

  // Calculate the column 0, 1, 2, 3
  {
    // stage 0
    // stage 1
    // stage 2
    x = _mm256_mullo_epi32(in[0], cospi62);
    v[0] = _mm256_add_epi32(x, rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    v[1] = _mm256_sub_epi32(zero, x);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    // stage 3
    v[8] = v[0];
    v[9] = v[1];

    // stage 4
    temp1 = _mm256_mullo_epi32(v[8], cospi8);
    x = _mm256_mullo_epi32(v[9], cospi56);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[8], cospi56);
    x = _mm256_mullo_epi32(v[9], cospi8);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[8] = temp1;
    v[9] = temp2;

    // stage 5
    v[4] = v[0];
    v[5] = v[1];
    v[12] = v[8];
    v[13] = v[9];

    // stage 6
    temp1 = _mm256_mullo_epi32(v[4], cospi16);
    x = _mm256_mullo_epi32(v[5], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[4], cospi48);
    x = _mm256_mullo_epi32(v[5], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[4] = temp1;
    v[5] = temp2;

    temp1 = _mm256_mullo_epi32(v[12], cospi16);
    x = _mm256_mullo_epi32(v[13], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[12], cospi48);
    x = _mm256_mullo_epi32(v[13], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[12] = temp1;
    v[13] = temp2;

    // stage 7
    v[2] = v[0];
    v[3] = v[1];
    v[6] = v[4];
    v[7] = v[5];
    v[10] = v[8];
    v[11] = v[9];
    v[14] = v[12];
    v[15] = v[13];

    // stage 8
    y = _mm256_mullo_epi32(v[2], cospi32);
    x = _mm256_mullo_epi32(v[3], cospi32);
    v[2] = _mm256_add_epi32(y, x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(y, x);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    y = _mm256_mullo_epi32(v[6], cospi32);
    x = _mm256_mullo_epi32(v[7], cospi32);
    v[6] = _mm256_add_epi32(y, x);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(y, x);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    y = _mm256_mullo_epi32(v[10], cospi32);
    x = _mm256_mullo_epi32(v[11], cospi32);
    v[10] = _mm256_add_epi32(y, x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(y, x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    y = _mm256_mullo_epi32(v[14], cospi32);
    x = _mm256_mullo_epi32(v[15], cospi32);
    v[14] = _mm256_add_epi32(y, x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(y, x);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = v[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), v[8]);
      out[2] = v[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), v[4]);
      out[4] = v[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), v[14]);
      out[6] = v[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), v[2]);
      out[8] = v[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), v[11]);
      out[10] = v[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), v[7]);
      out[12] = v[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), v[13]);
      out[14] = v[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), v[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}